

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.h
# Opt level: O2

void __thiscall
kj::Function<void_()>::
Impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-xthread-test.c++:685:17)>
::operator()(Impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_xthread_test_c__:685:17)>
             *this)

{
  Waiter *pWVar1;
  long in_FS_OFFSET;
  WaitScope waitScope;
  PredicateImpl impl;
  EventLoop loop;
  UnixEventPort port;
  undefined1 local_1d9;
  undefined1 local_1d8 [24];
  undefined4 local_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined **local_1a8;
  Maybe<kj::_::Mutex::Waiter_&> local_1a0;
  Waiter *local_198;
  undefined1 local_190;
  EventLoop local_180;
  UnixEventPort local_108;
  
  *(undefined1 *)(in_FS_OFFSET + -0x39) = 1;
  UnixEventPort::UnixEventPort(&local_108);
  EventLoop::EventLoop(&local_180,&local_108.super_EventPort);
  local_1c0 = 0xffffffff;
  local_1b8 = 0;
  uStack_1b0 = 0;
  local_1d8._16_8_ = &local_180;
  EventLoop::enterScope(&local_180);
  pWVar1 = (Waiter *)getCurrentThreadExecutor();
  MutexGuarded<kj::Maybe<const_kj::Executor_&>_>::lockExclusive
            ((MutexGuarded<kj::Maybe<const_kj::Executor_&>_> *)&local_1a8,(this->f).executor);
  ((local_1a0.ptr)->next).ptr = pWVar1;
  Locked<kj::Maybe<const_kj::Executor_&>_>::~Locked
            ((Locked<kj::Maybe<const_kj::Executor_&>_> *)&local_1a8);
  MutexGuarded<kj::Maybe<const_kj::Executor_&>_>::lockExclusive
            ((MutexGuarded<kj::Maybe<const_kj::Executor_&>_> *)local_1d8,(this->f).executor);
  local_1a8 = &PTR_check_00582cb0;
  local_1a0.ptr = (Waiter *)&local_1d9;
  local_198 = (Waiter *)local_1d8._8_8_;
  local_190 = 0;
  kj::_::Mutex::wait((Mutex *)local_1d8._0_8_,&local_1a8);
  Locked<kj::Maybe<const_kj::Executor_&>_>::~Locked
            ((Locked<kj::Maybe<const_kj::Executor_&>_> *)local_1d8);
  WaitScope::~WaitScope((WaitScope *)(local_1d8 + 0x10));
  EventLoop::~EventLoop(&local_180);
  UnixEventPort::~UnixEventPort(&local_108);
  return;
}

Assistant:

Return operator()(Params... params) override {
      return f(kj::fwd<Params>(params)...);
    }